

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

Emb_Obj_t * Emb_ManRandomVertex(Emb_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  Gia_Man_t *pGVar4;
  
  uVar2 = Gia_ManRandom(0);
  pGVar4 = p->pGia;
  uVar3 = (ulong)(uVar2 * 0x38f) % (ulong)(uint)pGVar4->nObjs;
  if ((-1 < (int)uVar3) && ((int)uVar3 < pGVar4->nObjs)) {
    do {
      uVar3 = (ulong)pGVar4->pObjs[uVar3].Value;
      if ((uVar3 != 0xffffffff) &&
         ((piVar1 = p->pObjData, piVar1 != (int *)0x0 &&
          (0xf < (uint)piVar1[uVar3] && (piVar1[uVar3] & 3U) == 0)))) {
        return (Emb_Obj_t *)(piVar1 + uVar3);
      }
      uVar2 = Gia_ManRandom(0);
      pGVar4 = p->pGia;
      uVar3 = (ulong)(uVar2 * 0x38f) % (ulong)(uint)pGVar4->nObjs;
    } while ((-1 < (int)uVar3) && ((int)uVar3 < pGVar4->nObjs));
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

Emb_Obj_t * Emb_ManRandomVertex( Emb_Man_t * p )
{
    Emb_Obj_t * pPivot;
    do {
        int iNode = (911 * Gia_ManRandom(0)) % Gia_ManObjNum(p->pGia);
        if ( ~Gia_ManObj(p->pGia, iNode)->Value )
            pPivot = Emb_ManObj( p, Gia_ManObj(p->pGia, iNode)->Value );
        else
            pPivot = NULL;
    }
    while ( pPivot == NULL || !Emb_ObjIsNode(pPivot) );
    return pPivot;
}